

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O1

spv_result_t spvtools::val::CfgPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint16_t uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  spv_result_t sVar6;
  spv_result_t sVar7;
  Function *pFVar8;
  BasicBlock *pBVar9;
  Instruction *pIVar10;
  char *pcVar11;
  spv_result_t unaff_EBP;
  ExecutionModel model;
  char *pcVar12;
  ulong uVar13;
  undefined1 auVar14 [8];
  bool bVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cases;
  uint local_29c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_298;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_278;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_258;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_220;
  undefined1 local_208 [8];
  uint *puStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [28];
  spv_result_t local_38;
  
  uVar1 = (inst->inst_).opcode;
  switch(uVar1) {
  case 0xf6:
    bVar15 = false;
    uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    sVar7 = MergeBlockAssert(_,uVar4);
    if (sVar7 == SPV_SUCCESS) {
      pFVar8 = ValidationState_t::current_function(_);
      sVar6 = Function::RegisterLoopMerge(pFVar8,uVar4,uVar5);
      bVar15 = sVar6 == SPV_SUCCESS;
      if (!bVar15) {
        sVar7 = sVar6;
      }
    }
    break;
  case 0xf7:
    bVar15 = false;
    uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    sVar7 = MergeBlockAssert(_,uVar4);
    if (sVar7 == SPV_SUCCESS) {
      pFVar8 = ValidationState_t::current_function(_);
      sVar6 = Function::RegisterSelectionMerge(pFVar8,uVar4);
      bVar15 = sVar6 == SPV_SUCCESS;
      if (!bVar15) {
        sVar7 = sVar6;
      }
    }
    break;
  case 0xf8:
    pFVar8 = ValidationState_t::current_function(_);
    sVar7 = Function::RegisterBlock(pFVar8,(inst->inst_).result_id,true);
    if (sVar7 == SPV_SUCCESS) {
      pFVar8 = ValidationState_t::current_function(_);
      pBVar9 = Function::current_block(pFVar8);
      pBVar9->label_ = inst;
      return SPV_SUCCESS;
    }
    return sVar7;
  case 0xf9:
    uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    sVar7 = FirstBlockAssert(_,uVar4);
    if (sVar7 != SPV_SUCCESS) {
      return sVar7;
    }
    pFVar8 = ValidationState_t::current_function(_);
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start + 4);
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = uVar4;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    Function::RegisterBlockEnd(pFVar8,&local_238);
    auVar14 = (undefined1  [8])
              local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar3 = local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    goto joined_r0x006221dd;
  case 0xfa:
    uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    sVar6 = FirstBlockAssert(_,uVar4);
    sVar7 = sVar6;
    if ((sVar6 == SPV_SUCCESS) && (sVar7 = FirstBlockAssert(_,uVar5), sVar7 == SPV_SUCCESS)) {
      pFVar8 = ValidationState_t::current_function(_);
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(8);
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 2;
      *(ulong *)local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = CONCAT44(uVar5,uVar4);
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      Function::RegisterBlockEnd(pFVar8,&local_258);
      bVar15 = true;
      sVar7 = sVar6;
      if (local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_258.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_258.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      bVar15 = false;
    }
    break;
  case 0xfb:
    local_208 = (undefined1  [8])0x0;
    puStack_200 = (uint *)0x0;
    local_1f8[0]._M_allocated_capacity = (uint *)0x0;
    bVar15 = 0x10 < (ulong)((long)(inst->operands_).
                                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(inst->operands_).
                                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
    if (bVar15) {
      local_29c = Instruction::GetOperandAs<unsigned_int>(inst,1);
      sVar7 = FirstBlockAssert(_,local_29c);
      unaff_EBP = sVar7;
      if (sVar7 == SPV_SUCCESS) {
        uVar13 = 3;
        do {
          if (puStack_200 == (uint *)local_1f8[0]._0_8_) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_208,
                       (iterator)puStack_200,&local_29c);
          }
          else {
            *puStack_200 = local_29c;
            puStack_200 = puStack_200 + 1;
          }
          bVar15 = uVar13 < (ulong)((long)(inst->operands_).
                                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(inst->operands_).
                                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4);
          unaff_EBP = sVar7;
          if (!bVar15) break;
          local_29c = Instruction::GetOperandAs<unsigned_int>(inst,uVar13);
          unaff_EBP = FirstBlockAssert(_,local_29c);
          uVar13 = uVar13 + 2;
        } while (unaff_EBP == SPV_SUCCESS);
      }
    }
    if (bVar15) {
      if (local_208 != (undefined1  [8])0x0) {
        operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity - (long)local_208);
        return unaff_EBP;
      }
      return unaff_EBP;
    }
    pFVar8 = ValidationState_t::current_function(_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_220,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208);
    Function::RegisterBlockEnd(pFVar8,&local_220);
    auVar14 = local_208;
    uVar3 = local_1f8[0]._M_allocated_capacity;
    if (local_220.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_220.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_220.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_220.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      auVar14 = local_208;
      uVar3 = local_1f8[0]._M_allocated_capacity;
    }
joined_r0x006221dd:
    if (auVar14 == (undefined1  [8])0x0) {
      return SPV_SUCCESS;
    }
    uVar13 = uVar3 - (long)auVar14;
LAB_00621f13:
    operator_delete((void *)auVar14,uVar13);
    return SPV_SUCCESS;
  case 0xfd:
    pFVar8 = ValidationState_t::current_function(_);
    pIVar10 = ValidationState_t::FindDef(_,pFVar8->result_type_id_);
    if (pIVar10 == (Instruction *)0x0) {
      __assert_fail("return_type_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp"
                    ,0x48d,
                    "spv_result_t spvtools::val::CfgPass(ValidationState_t &, const Instruction *)")
      ;
    }
    uVar2 = (pIVar10->inst_).opcode;
    if (uVar2 == 0x13) {
      pFVar8 = ValidationState_t::current_function(_);
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Function::RegisterBlockEnd(pFVar8,&local_278);
      local_38 = unaff_EBP;
      if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_278.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_278.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_CFG,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpReturn can only be called from a function with void ",0x36)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"return type.",0xc);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    }
    if (uVar2 == 0x13) {
      return SPV_SUCCESS;
    }
    return local_38;
  default:
    if (((0x21 < uVar1 - 0x1140) || ((0x300000001U >> ((ulong)(uVar1 - 0x1140) & 0x3f) & 1) == 0))
       && (uVar1 != 0x14ae)) {
      return SPV_SUCCESS;
    }
  case 0xfc:
  case 0xfe:
  case 0xff:
    pFVar8 = ValidationState_t::current_function(_);
    local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Function::RegisterBlockEnd(pFVar8,&local_298);
    if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_298.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_298.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (uVar1 < 0x1160) {
      if (uVar1 == 0xfc) {
        pFVar8 = ValidationState_t::current_function(_);
        pcVar12 = "OpKill requires Fragment execution model";
        pcVar11 = "";
      }
      else {
        if (uVar1 != 0x1140) {
          return SPV_SUCCESS;
        }
        pFVar8 = ValidationState_t::current_function(_);
        pcVar12 = "OpTerminateInvocation requires Fragment execution model";
        pcVar11 = "";
      }
      local_208 = (undefined1  [8])local_1f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,pcVar12,pcVar11);
      model = ExecutionModelFragment;
    }
    else {
      if (uVar1 == 0x1160) {
        pFVar8 = ValidationState_t::current_function(_);
        pcVar12 = "OpIgnoreIntersectionKHR requires AnyHitKHR execution model";
        pcVar11 = "";
      }
      else {
        if (uVar1 != 0x1161) {
          return SPV_SUCCESS;
        }
        pFVar8 = ValidationState_t::current_function(_);
        pcVar12 = "OpTerminateRayKHR requires AnyHitKHR execution model";
        pcVar11 = "";
      }
      local_208 = (undefined1  [8])local_1f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,pcVar12,pcVar11);
      model = AnyHitKHR;
    }
    Function::RegisterExecutionModelLimitation(pFVar8,model,(string *)local_208);
    if (local_208 == (undefined1  [8])local_1f8) {
      return SPV_SUCCESS;
    }
    uVar13 = local_1f8[0]._M_allocated_capacity + 1;
    auVar14 = local_208;
    goto LAB_00621f13;
  }
  if (bVar15) {
    return SPV_SUCCESS;
  }
  return sVar7;
}

Assistant:

spv_result_t CfgPass(ValidationState_t& _, const Instruction* inst) {
  spv::Op opcode = inst->opcode();
  switch (opcode) {
    case spv::Op::OpLabel:
      if (auto error = _.current_function().RegisterBlock(inst->id()))
        return error;

      // TODO(github:1661) This should be done in the
      // ValidationState::RegisterInstruction method but because of the order of
      // passes the OpLabel ends up not being part of the basic block it starts.
      _.current_function().current_block()->set_label(inst);
      break;
    case spv::Op::OpLoopMerge: {
      uint32_t merge_block = inst->GetOperandAs<uint32_t>(0);
      uint32_t continue_block = inst->GetOperandAs<uint32_t>(1);
      CFG_ASSERT(MergeBlockAssert, merge_block);

      if (auto error = _.current_function().RegisterLoopMerge(merge_block,
                                                              continue_block))
        return error;
    } break;
    case spv::Op::OpSelectionMerge: {
      uint32_t merge_block = inst->GetOperandAs<uint32_t>(0);
      CFG_ASSERT(MergeBlockAssert, merge_block);

      if (auto error = _.current_function().RegisterSelectionMerge(merge_block))
        return error;
    } break;
    case spv::Op::OpBranch: {
      uint32_t target = inst->GetOperandAs<uint32_t>(0);
      CFG_ASSERT(FirstBlockAssert, target);

      _.current_function().RegisterBlockEnd({target});
    } break;
    case spv::Op::OpBranchConditional: {
      uint32_t tlabel = inst->GetOperandAs<uint32_t>(1);
      uint32_t flabel = inst->GetOperandAs<uint32_t>(2);
      CFG_ASSERT(FirstBlockAssert, tlabel);
      CFG_ASSERT(FirstBlockAssert, flabel);

      _.current_function().RegisterBlockEnd({tlabel, flabel});
    } break;

    case spv::Op::OpSwitch: {
      std::vector<uint32_t> cases;
      for (size_t i = 1; i < inst->operands().size(); i += 2) {
        uint32_t target = inst->GetOperandAs<uint32_t>(i);
        CFG_ASSERT(FirstBlockAssert, target);
        cases.push_back(target);
      }
      _.current_function().RegisterBlockEnd({cases});
    } break;
    case spv::Op::OpReturn: {
      const uint32_t return_type = _.current_function().GetResultTypeId();
      const Instruction* return_type_inst = _.FindDef(return_type);
      assert(return_type_inst);
      if (return_type_inst->opcode() != spv::Op::OpTypeVoid)
        return _.diag(SPV_ERROR_INVALID_CFG, inst)
               << "OpReturn can only be called from a function with void "
               << "return type.";
      _.current_function().RegisterBlockEnd(std::vector<uint32_t>());
      break;
    }
    case spv::Op::OpKill:
    case spv::Op::OpReturnValue:
    case spv::Op::OpUnreachable:
    case spv::Op::OpTerminateInvocation:
    case spv::Op::OpIgnoreIntersectionKHR:
    case spv::Op::OpTerminateRayKHR:
    case spv::Op::OpEmitMeshTasksEXT:
      _.current_function().RegisterBlockEnd(std::vector<uint32_t>());
      // Ops with dedicated passes check for the Execution Model there
      if (opcode == spv::Op::OpKill) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::Fragment,
            "OpKill requires Fragment execution model");
      }
      if (opcode == spv::Op::OpTerminateInvocation) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::Fragment,
            "OpTerminateInvocation requires Fragment execution model");
      }
      if (opcode == spv::Op::OpIgnoreIntersectionKHR) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::AnyHitKHR,
            "OpIgnoreIntersectionKHR requires AnyHitKHR execution model");
      }
      if (opcode == spv::Op::OpTerminateRayKHR) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::AnyHitKHR,
            "OpTerminateRayKHR requires AnyHitKHR execution model");
      }

      break;
    default:
      break;
  }
  return SPV_SUCCESS;
}